

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O1

CK_RV __thiscall Token::loginSO(Token *this,ByteString *pin)

{
  bool bVar1;
  int iVar2;
  CK_RV CVar3;
  CK_ULONG flags;
  MutexLocker lock;
  ulong local_30;
  MutexLocker local_28;
  
  MutexLocker::MutexLocker(&local_28,this->tokenMutex);
  CVar3 = 5;
  if (this->sdm != (SecureDataManager *)0x0) {
    bVar1 = SecureDataManager::isUserLoggedIn(this->sdm);
    CVar3 = 0x104;
    if (!bVar1) {
      bVar1 = SecureDataManager::isSOLoggedIn(this->sdm);
      CVar3 = 0x100;
      if (!bVar1) {
        iVar2 = (*this->token->_vptr_ObjectStoreToken[4])(this->token,&local_30);
        if ((char)iVar2 == '\0') {
          softHSMLog(3,"loginSO",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/slot_mgr/Token.cpp"
                     ,0x84,"Could not get the token flags");
          CVar3 = 5;
        }
        else {
          bVar1 = SecureDataManager::loginSO(this->sdm,pin);
          if (bVar1) {
            local_30 = local_30 & 0xffffffffffefffff;
            (*this->token->_vptr_ObjectStoreToken[5])();
            CVar3 = 0;
          }
          else {
            local_30 = local_30 | 0x100000;
            CVar3 = 0xa0;
            (*this->token->_vptr_ObjectStoreToken[5])();
          }
        }
      }
    }
  }
  MutexLocker::~MutexLocker(&local_28);
  return CVar3;
}

Assistant:

CK_RV Token::loginSO(ByteString& pin)
{
	CK_ULONG flags;

	// Lock access to the token
	MutexLocker lock(tokenMutex);

	if (sdm == NULL) return CKR_GENERAL_ERROR;

	// User cannot be logged in
	if (sdm->isUserLoggedIn()) return CKR_USER_ANOTHER_ALREADY_LOGGED_IN;

	// SO cannot be logged in
	if (sdm->isSOLoggedIn()) return CKR_USER_ALREADY_LOGGED_IN;

	// Get token flags
	if (!token->getTokenFlags(flags))
	{
		ERROR_MSG("Could not get the token flags");
		return CKR_GENERAL_ERROR;
	}

	// Login
	if (!sdm->loginSO(pin))
	{
		flags |= CKF_SO_PIN_COUNT_LOW;
		token->setTokenFlags(flags);
		return CKR_PIN_INCORRECT;
	}

	flags &= ~CKF_SO_PIN_COUNT_LOW;
	token->setTokenFlags(flags);
	return CKR_OK;
}